

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformAccessLogger::assign3f
          (UniformAccessLogger *this,string *name,float x,float y,float z)

{
  ostringstream *this_00;
  int iVar1;
  Vector<float,_3> local_1ac;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = getLocation(this,name);
  local_1a0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Assigning to uniform ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
  local_1ac.m_data[0] = x;
  local_1ac.m_data[1] = y;
  local_1ac.m_data[2] = z;
  tcu::operator<<((ostream *)this_00,&local_1ac);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  (*this->m_gl->uniform3f)(iVar1,x,y,z);
  return;
}

Assistant:

void UniformAccessLogger::assign3f (const string& name, float x, float y, float z)
{
	const int loc = getLocation(name);
	m_log << TestLog::Message << "// Assigning to uniform " << name << ": " << Vec3(x, y, z) << TestLog::EndMessage;
	m_gl.uniform3f(loc, x, y, z);
}